

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O2

float __thiscall ImpactGenerator::Impact::Process(Impact *this,Random *random)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->cut;
  this->volume = this->decay * this->volume;
  this->lpf = this->bpf * fVar2 + this->lpf;
  fVar1 = Random::GetFloat(random,-1.0,1.0);
  fVar2 = ((fVar1 - this->lpf) - this->bw * this->bpf) * fVar2 + this->bpf;
  this->bpf = fVar2;
  return fVar2 * this->volume;
}

Assistant:

inline float Process(Random& random)
        {
            volume *= decay;
            lpf += cut * bpf;
            bpf += cut * (random.GetFloat(-1.0f, 1.0f) - lpf - bpf * bw);
            return bpf * volume;
        }